

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eager_singletons.cpp
# Opt level: O2

int main(void)

{
  uint __line;
  provider<boost::ext::di::v1_3_0::aux::pair<implementation,_boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::uniform,_boost::ext::di::v1_3_0::aux::type_list<>_>_>,_boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_i>_>
  *in_RSI;
  undefined1 *provider;
  scope_impl<implementation,boost::ext::di::v1_3_0::aux::integral_constant<bool,true>> *in_RDI;
  scope_impl<implementation,boost::ext::di::v1_3_0::aux::integral_constant<bool,true>> *this;
  char *__assertion;
  example local_19;
  __shared_ptr<interface,(__gnu_cxx::_Lock_policy)2> local_18 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_10;
  
  if (implementation::ctor_calls()::calls == 0) {
    boost::ext::di::v1_3_0::scopes::singleton::
    scope_impl<implementation,boost::ext::di::v1_3_0::aux::integral_constant<bool,true>>::operator()
              (in_RDI,in_RSI);
    provider = boost::ext::di::v1_3_0::scopes::singleton::
               scope_impl<implementation,boost::ext::di::v1_3_0::aux::integral_constant<bool,true>>
               ::
               create_impl<implementation,boost::ext::di::v1_3_0::core::successful::provider<boost::ext::di::v1_3_0::aux::pair<implementation,boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::uniform,boost::ext::di::v1_3_0::aux::type_list<>>>,boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>,boost::ext::di::v1_3_0::detail::$_0::operator()<boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::singleton,interface,implementation,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,int,int,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>>>(boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::...,int,int,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>>)const::i>>const&)
               ::object;
    std::__shared_ptr<interface,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<implementation,void>
              (local_18,(__shared_ptr<implementation,_(__gnu_cxx::_Lock_policy)2> *)
                        boost::ext::di::v1_3_0::scopes::singleton::
                        scope_impl<implementation,boost::ext::di::v1_3_0::aux::integral_constant<bool,true>>
                        ::
                        create_impl<implementation,boost::ext::di::v1_3_0::core::successful::provider<boost::ext::di::v1_3_0::aux::pair<implementation,boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::uniform,boost::ext::di::v1_3_0::aux::type_list<>>>,boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>,boost::ext::di::v1_3_0::detail::$_0::operator()<boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::singleton,interface,implementation,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,int,int,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>>>(boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::...,int,int,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>>)const::i>>const&)
                        ::object);
    this = (scope_impl<implementation,boost::ext::di::v1_3_0::aux::integral_constant<bool,true>> *)
           &local_10;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)this);
    if (implementation::ctor_calls()::calls == 1) {
      boost::ext::di::v1_3_0::scopes::singleton::
      scope_impl<implementation,boost::ext::di::v1_3_0::aux::integral_constant<bool,true>>::
      operator()(this,(provider<boost::ext::di::v1_3_0::aux::pair<implementation,_boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::uniform,_boost::ext::di::v1_3_0::aux::type_list<>_>_>,_boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_i>_>
                       *)provider);
      std::__shared_ptr<interface,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<implementation,void>
                (local_18,(__shared_ptr<implementation,_(__gnu_cxx::_Lock_policy)2> *)
                          boost::ext::di::v1_3_0::scopes::singleton::
                          scope_impl<implementation,boost::ext::di::v1_3_0::aux::integral_constant<bool,true>>
                          ::
                          create_impl<implementation,boost::ext::di::v1_3_0::core::successful::provider<boost::ext::di::v1_3_0::aux::pair<implementation,boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::uniform,boost::ext::di::v1_3_0::aux::type_list<>>>,boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>,boost::ext::di::v1_3_0::detail::$_0::operator()<boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::singleton,interface,implementation,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,int,int,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>>>(boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::...,int,int,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>>)const::i>>const&)
                          ::object);
      example::example(&local_19,0x2a,(shared_ptr<interface> *)local_18);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_10);
      if (implementation::ctor_calls()::calls == 1) {
        return 0;
      }
      __assertion = "1 == implementation::ctor_calls()";
      __line = 0x52;
    }
    else {
      __assertion = "1 == implementation::ctor_calls()";
      __line = 0x4e;
    }
  }
  else {
    __assertion = "0 == implementation::ctor_calls()";
    __line = 0x4a;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/eager_singletons.cpp"
                ,__line,"int main()");
}

Assistant:

int main() {
  /*<<make injector configuration>>*/
  auto injector = di::make_injector(configuration());
  assert(0 == implementation::ctor_calls());

  /*<<eagerly initialize singletons>>*/
  eager_singletons(injector);
  assert(1 == implementation::ctor_calls());

  /*<<create `example` with already initialized singletons>>*/
  injector.create<example>();
  assert(1 == implementation::ctor_calls());
}